

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

void __thiscall
TPZMatrix<Fad<float>_>::MultAdd
          (TPZMatrix<Fad<float>_> *this,TPZFMatrix<Fad<float>_> *x,TPZFMatrix<Fad<float>_> *y,
          TPZFMatrix<Fad<float>_> *z,Fad<float> *alpha,Fad<float> *beta,int opt)

{
  long lVar1;
  Fad<float> *pFVar2;
  long col;
  long lVar3;
  long lVar4;
  long lVar5;
  Fad<float> val;
  long local_110;
  FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> local_e0;
  undefined1 local_d0 [32];
  Fad<float> local_b0;
  Fad<float> local_90;
  Fad<float> *local_70;
  Fad<float> *local_68;
  Fad<float> **local_60;
  Fad<float> *local_58;
  Fad<float> local_50;
  
  if (opt == 0) {
    lVar1 = (this->super_TPZBaseMatrix).fCol;
    if (lVar1 == (x->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fRow) goto LAB_00d255bb;
  }
  else {
    lVar1 = (x->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fRow;
LAB_00d255bb:
    if ((this->super_TPZBaseMatrix).fRow == lVar1) goto LAB_00d255cf;
  }
  Error("Operator* <matrices with incompatible dimensions>",(char *)0x0);
LAB_00d255cf:
  local_110 = (x->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fCol;
  if ((local_110 != (y->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fCol) ||
     ((x->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fRow !=
      (y->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fRow)) {
    Error("TPZFMatrix::MultiplyAdd incompatible dimensions\n",(char *)0x0);
    local_110 = (x->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fCol;
  }
  lVar1 = (this->super_TPZBaseMatrix).fRow;
  lVar3 = (this->super_TPZBaseMatrix).fCol;
  Fad<float>::Fad(&local_50,beta);
  PrepareZ(this,y,z,&local_50,opt);
  Fad<float>::~Fad(&local_50);
  local_90.val_ = 0.0;
  local_90.dx_.num_elts = 0;
  local_90.dx_.ptr_to_data = (float *)0x0;
  local_90.defaultVal = 0.0;
  col = 0;
  if (lVar3 < 1) {
    lVar3 = col;
  }
  if (lVar1 < 1) {
    lVar1 = col;
  }
  if (local_110 < 1) {
    local_110 = col;
  }
  for (; col != local_110; col = col + 1) {
    lVar4 = 0;
    if (opt == 0) {
      for (; lVar4 != lVar3; lVar4 = lVar4 + 1) {
        for (lVar5 = 0; lVar1 != lVar5; lVar5 = lVar5 + 1) {
          pFVar2 = TPZFMatrix<Fad<float>_>::operator()(z,lVar5,col);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&local_b0,this,lVar5,lVar4);
          local_70 = alpha;
          local_68 = &local_b0;
          (*(x->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0x24])((Fad<float> *)local_d0,x,lVar4,col);
          local_60 = &local_70;
          local_e0.fadexpr_.right_ = (Fad<float> *)&local_60;
          local_e0.fadexpr_.left_ = pFVar2;
          local_58 = (Fad<float> *)local_d0;
          Fad<float>::operator=
                    (&local_90,
                     (FadExpr<FadBinaryAdd<Fad<float>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>_>_>
                      *)&local_e0);
          Fad<float>::~Fad((Fad<float> *)local_d0);
          Fad<float>::~Fad(&local_b0);
          (*(z->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0x23])(z,lVar5,col,&local_90);
        }
      }
    }
    else {
      for (; lVar4 != lVar1; lVar4 = lVar4 + 1) {
        local_b0.val_ = 0.0;
        local_b0._4_4_ = 0;
        Fad<float>::operator=<double,_nullptr>(&local_90,(double *)&local_b0);
        for (lVar5 = 0; lVar3 != lVar5; lVar5 = lVar5 + 1) {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&local_b0,this,lVar5,lVar4);
          (*(x->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0x24])((Fad<float> *)local_d0,x,lVar5,col);
          local_e0.fadexpr_.left_ = &local_b0;
          local_e0.fadexpr_.right_ = (Fad<float> *)local_d0;
          Fad<float>::operator+=(&local_90,&local_e0);
          Fad<float>::~Fad((Fad<float> *)local_d0);
          Fad<float>::~Fad(&local_b0);
        }
        local_d0._8_8_ = &local_90;
        local_d0._0_8_ = alpha;
        Fad<float>::Fad<FadBinaryMul<Fad<float>,Fad<float>>>
                  (&local_b0,(FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> *)local_d0);
        (*(z->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x23])(z,lVar4,col,&local_b0);
        Fad<float>::~Fad(&local_b0);
      }
    }
  }
  Fad<float>::~Fad(&local_90);
  return;
}

Assistant:

void TPZMatrix<TVar>::MultAdd(const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z, const TVar alpha,const TVar beta,const int opt) const {
	if ((!opt && Cols() != x.Rows()) || Rows() != x.Rows())
		Error( "Operator* <matrices with incompatible dimensions>" );
	if(x.Cols() != y.Cols() || x.Rows() != y.Rows()) {
		Error ("TPZFMatrix::MultiplyAdd incompatible dimensions\n");
	}
	int64_t rows = Rows();
	int64_t cols = Cols();
	int64_t xcols = x.Cols();
	int64_t ic, c, r;
	PrepareZ(y,z,beta,opt);
	TVar val = 0.;
	for (ic = 0; ic < xcols; ic++) {
		if(!opt) {
			for ( c = 0; c<cols; c++) {
				for ( r = 0; r < rows; r++ ) {
					val = z(r,ic) + alpha * GetVal(r,c) * x.GetVal(c,ic);
					z.PutVal(r,ic,val);
				}
			}
		} else {
			for (r = 0; r<rows; r++) {
            	val = 0.;
				for(c = 0; c<cols; c++) {
					val += GetVal(c,r)* x.GetVal(c,ic);
				}
				z.PutVal(r,ic,alpha*val);
			}
		}
	}
}